

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

void DBaseDecal::SerializeChain(FArchive *arc,DBaseDecal **first)

{
  bool bVar1;
  DBaseDecal *local_30;
  DBaseDecal **firstptr;
  DBaseDecal *fresh;
  DBaseDecal **ppDStack_18;
  DWORD numInChain;
  DBaseDecal **first_local;
  FArchive *arc_local;
  
  ppDStack_18 = first;
  first_local = (DBaseDecal **)arc;
  bVar1 = FArchive::IsLoading(arc);
  if (bVar1) {
    fresh._4_4_ = FArchive::ReadCount((FArchive *)first_local);
    local_30 = (DBaseDecal *)first;
    while (fresh._4_4_ != 0) {
      fresh._4_4_ = fresh._4_4_ - 1;
      ::operator<<((FArchive *)first_local,(DBaseDecal **)&firstptr);
      (local_30->super_DThinker).super_DObject._vptr_DObject = (_func_int **)firstptr;
      firstptr[8] = local_30;
      local_30 = (DBaseDecal *)(firstptr + 7);
    }
  }
  else {
    fresh._4_4_ = 0;
    for (firstptr = (DBaseDecal **)*first; firstptr != (DBaseDecal **)0x0;
        firstptr = (DBaseDecal **)firstptr[7]) {
      fresh._4_4_ = fresh._4_4_ + 1;
    }
    FArchive::WriteCount((FArchive *)first_local,fresh._4_4_);
    firstptr = (DBaseDecal **)*first;
    while (fresh._4_4_ != 0) {
      fresh._4_4_ = fresh._4_4_ - 1;
      ::operator<<((FArchive *)first_local,(DBaseDecal **)&firstptr);
      firstptr = (DBaseDecal **)firstptr[7];
    }
  }
  return;
}

Assistant:

void DBaseDecal::SerializeChain (FArchive &arc, DBaseDecal **first)
{
	DWORD numInChain;
	DBaseDecal *fresh;
	DBaseDecal **firstptr = first;

	if (arc.IsLoading ())
	{
		numInChain = arc.ReadCount ();
		
		while (numInChain--)
		{
			arc << fresh;
			*firstptr = fresh;
			fresh->WallPrev = firstptr;
			firstptr = &fresh->WallNext;
		}
	}
	else
	{
		numInChain = 0;
		fresh = *firstptr;
		while (fresh != NULL)
		{
			fresh = fresh->WallNext;
			++numInChain;
		}
		arc.WriteCount (numInChain);
		fresh = *firstptr;
		while (numInChain--)
		{
			arc << fresh;
			fresh = fresh->WallNext;
		}
	}
}